

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void setStickyKeys(_GLFWwindow *window,int enabled)

{
  int local_18;
  int i;
  int enabled_local;
  _GLFWwindow *window_local;
  
  if ((uint)window->stickyKeys != enabled) {
    if (enabled == 0) {
      for (local_18 = 0; local_18 < 0x15d; local_18 = local_18 + 1) {
        if (window->keys[local_18] == '\x03') {
          window->keys[local_18] = '\0';
        }
      }
    }
    window->stickyKeys = (GLboolean)enabled;
  }
  return;
}

Assistant:

static void setStickyKeys(_GLFWwindow* window, int enabled)
{
    if (window->stickyKeys == enabled)
        return;

    if (!enabled)
    {
        int i;

        // Release all sticky keys
        for (i = 0;  i <= GLFW_KEY_LAST;  i++)
        {
            if (window->keys[i] == _GLFW_STICK)
                window->keys[i] = GLFW_RELEASE;
        }
    }

    window->stickyKeys = enabled;
}